

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

double Cudd_AverageDistance(DdManager *dd)

{
  uint uVar1;
  DdManager *pDVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  DdNode *pDVar7;
  long lVar8;
  DdNode *sentinel;
  DdNode *pDVar9;
  long lVar10;
  DdManager *pDVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar1 = dd->size;
  if ((ulong)uVar1 == 0) {
    return 0.0;
  }
  dVar13 = 0.0;
  dVar15 = 0.0;
  dVar14 = 0.0;
  dVar16 = 0.0;
  dVar12 = 0.0;
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      lVar6 = (long)(int)dd->subtables[uVar3].slots;
      if (lVar6 < 1) {
        dVar18 = 0.0;
        dVar17 = 0.0;
      }
      else {
        dVar17 = 0.0;
        lVar10 = 0;
        dVar18 = 0.0;
        do {
          pDVar11 = (DdManager *)dd->subtables[uVar3].nodelist[lVar10];
          if (pDVar11 != dd) {
            while( true ) {
              lVar8 = (long)pDVar11 - (long)(pDVar11->sentinel).type.kids.T;
              lVar4 = -lVar8;
              if (0 < lVar8) {
                lVar4 = lVar8;
              }
              lVar5 = (long)pDVar11 - ((ulong)(pDVar11->sentinel).type.kids.E & 0xfffffffffffffffe);
              lVar8 = -lVar5;
              if (0 < lVar5) {
                lVar8 = lVar5;
              }
              pDVar2 = (DdManager *)(pDVar11->sentinel).next;
              dVar18 = (double)lVar8 + (double)lVar4 + dVar18;
              dVar14 = dVar14 + 2.0;
              if (pDVar2 == dd) break;
              lVar8 = (long)pDVar11 - (long)pDVar2;
              lVar4 = -lVar8;
              if (0 < lVar8) {
                lVar4 = lVar8;
              }
              dVar17 = dVar17 + (double)lVar4;
              dVar16 = dVar16 + 1.0;
              pDVar11 = pDVar2;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar6);
      }
      dVar15 = dVar15 + dVar17;
      dVar12 = dVar12 + dVar18;
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  lVar6 = (long)(int)(dd->constants).slots;
  if (0 < lVar6) {
    dVar13 = 0.0;
    lVar10 = 0;
    do {
      pDVar7 = (dd->constants).nodelist[lVar10];
      if (pDVar7 != (DdNode *)0x0) {
        for (pDVar9 = pDVar7->next; pDVar9 != (DdNode *)0x0; pDVar9 = pDVar9->next) {
          lVar8 = (long)pDVar7 - (long)pDVar9;
          lVar4 = -lVar8;
          if (0 < lVar8) {
            lVar4 = lVar8;
          }
          dVar13 = dVar13 + (double)lVar4;
          dVar16 = dVar16 + 1.0;
          pDVar7 = pDVar9;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar6);
  }
  return (dVar12 + dVar15 + dVar13) / (dVar14 + dVar16);
}

Assistant:

double
Cudd_AverageDistance(
  DdManager * dd)
{
    double tetotal, nexttotal;
    double tesubtotal, nextsubtotal;
    double temeasured, nextmeasured;
    int i, j;
    int slots, nvars;
    long diff;
    DdNode *scan;
    DdNodePtr *nodelist;
    DdNode *sentinel = &(dd->sentinel);

    nvars = dd->size;
    if (nvars == 0) return(0.0);

    /* Initialize totals. */
    tetotal = 0.0;
    nexttotal = 0.0;
    temeasured = 0.0;
    nextmeasured = 0.0;

    /* Scan the variable subtables. */
    for (i = 0; i < nvars; i++) {
        nodelist = dd->subtables[i].nodelist;
        tesubtotal = 0.0;
        nextsubtotal = 0.0;
        slots = dd->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            scan = nodelist[j];
            while (scan != sentinel) {
                diff = (long) scan - (long) cuddT(scan);
                tesubtotal += (double) ddAbs(diff);
                diff = (long) scan - (long) Cudd_Regular(cuddE(scan));
                tesubtotal += (double) ddAbs(diff);
                temeasured += 2.0;
                if (scan->next != sentinel) {
                    diff = (long) scan - (long) scan->next;
                    nextsubtotal += (double) ddAbs(diff);
                    nextmeasured += 1.0;
                }
                scan = scan->next;
            }
        }
        tetotal += tesubtotal;
        nexttotal += nextsubtotal;
    }

    /* Scan the constant table. */
    nodelist = dd->constants.nodelist;
    nextsubtotal = 0.0;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if (scan->next != NULL) {
                diff = (long) scan - (long) scan->next;
                nextsubtotal += (double) ddAbs(diff);
                nextmeasured += 1.0;
            }
            scan = scan->next;
        }
    }
    nexttotal += nextsubtotal;

    return((tetotal + nexttotal) / (temeasured + nextmeasured));

}